

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O1

ssize_t __thiscall
pstore::repo::generic_section_creation_dispatcher::write
          (generic_section_creation_dispatcher *this,int __fd,void *__buf,size_t __n)

{
  section_content *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined4 in_register_00000034;
  generic_section *this_00;
  pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>
  local_40;
  pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>
  local_30;
  pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>
  local_20;
  
  this_00 = (generic_section *)CONCAT44(in_register_00000034,__fd);
  iVar2 = (*(this->super_section_creation_dispatcher)._vptr_section_creation_dispatcher[4])();
  if ((generic_section *)CONCAT44(extraout_var,iVar2) == this_00) {
    psVar1 = this->section_;
    local_40.first.pos_ = *(pointer *)(psVar1 + 0xa8);
    local_40.second.pos_ = local_40.first.pos_ + *(long *)(psVar1 + 8);
    local_30.first._M_current = *(internal_fixup **)(psVar1 + 0xb0);
    local_30.second._M_current = *(internal_fixup **)(psVar1 + 0xb8);
    local_20.first._M_current = *(external_fixup **)(psVar1 + 200);
    local_20.second._M_current = *(external_fixup **)(psVar1 + 0xd0);
    generic_section::
    generic_section<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
              (this_00,&local_40,&local_30,&local_20,(uint8_t)psVar1[1]);
    sVar3 = generic_section::size_bytes(this_00);
    return (long)&this_00->field_0 + sVar3;
  }
  assert_failed("this->aligned (out) == out",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/generic_section.cpp"
                ,99);
}

Assistant:

std::uint8_t * generic_section_creation_dispatcher::write (std::uint8_t * const out) const {
            PSTORE_ASSERT (this->aligned (out) == out);
            auto * const scn =
                new (out) generic_section (section_->make_sources (), section_->align);
            return out + scn->size_bytes ();
        }